

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O3

void duckdb::ArrayGenericFold<float,duckdb::InnerProductOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *count;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  pointer pcVar5;
  BoundFunctionExpression *pBVar6;
  reference pvVar7;
  Vector *vector;
  Vector *vector_00;
  idx_t iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  ulong uVar10;
  InvalidInputException *pIVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *idx;
  idx_t iVar13;
  ulong uVar14;
  float fVar15;
  UnifiedVectorFormat rhs_format;
  UnifiedVectorFormat lhs_format;
  string local_160;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  string local_100;
  string local_e0;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  pBVar6 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  count = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args->count;
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector = ArrayVector::GetEntry(pvVar7);
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  vector_00 = ArrayVector::GetEntry(pvVar7);
  FlatVector::VerifyFlatVector(vector);
  FlatVector::VerifyFlatVector(vector_00);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  Vector::ToUnifiedFormat(pvVar7,(idx_t)count,&local_78);
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  Vector::ToUnifiedFormat(pvVar7,(idx_t)count,&local_c0);
  pdVar1 = vector->data;
  pdVar2 = vector_00->data;
  pdVar3 = result->data;
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  iVar8 = ArrayType::GetSize(&pvVar7->type);
  if (count != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    idx = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      pbVar9 = idx;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)(local_78.sel)->sel_vector[(long)idx];
      }
      pbVar12 = idx;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)(local_c0.sel)->sel_vector[(long)idx];
      }
      if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
            [(ulong)pbVar9 >> 6] >> ((ulong)pbVar9 & 0x3f) & 1) != 0)) &&
         ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
            [(ulong)pbVar12 >> 6] >> ((ulong)pbVar12 & 0x3f) & 1) != 0)))) {
        uVar10 = (long)pbVar9 * iVar8;
        puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        iVar13 = iVar8;
        uVar14 = uVar10;
        if (uVar10 < uVar10 + iVar8 && puVar4 != (unsigned_long *)0x0) {
          do {
            if ((puVar4[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
              pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_120[0] = local_110;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_120,"%s: left argument can not contain NULL values","");
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              pcVar5 = (pBVar6->function).super_BaseScalarFunction.super_SimpleFunction.
                       super_Function.name._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e0,pcVar5,
                         pcVar5 + (pBVar6->function).super_BaseScalarFunction.super_SimpleFunction.
                                  super_Function.name._M_string_length);
              StringUtil::Format<std::__cxx11::string>
                        (&local_160,(StringUtil *)local_120,&local_e0,pbVar12);
              InvalidInputException::InvalidInputException(pIVar11,(string *)&local_160);
              __cxa_throw(pIVar11,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            uVar14 = uVar14 + 1;
            iVar13 = iVar13 - 1;
          } while (iVar13 != 0);
        }
        pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)pbVar12 * iVar8);
        puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        iVar13 = iVar8;
        pbVar9 = pbVar12;
        if (pbVar12 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&(pbVar12->_M_dataplus)._M_p + iVar8) && puVar4 != (unsigned_long *)0x0
           ) {
          do {
            if ((puVar4[(ulong)pbVar9 >> 6] >> ((ulong)pbVar9 & 0x3f) & 1) == 0) {
              pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_140[0] = local_130;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_140,"%s: right argument can not contain NULL values","");
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              pcVar5 = (pBVar6->function).super_BaseScalarFunction.super_SimpleFunction.
                       super_Function.name._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_100,pcVar5,
                         pcVar5 + (pBVar6->function).super_BaseScalarFunction.super_SimpleFunction.
                                  super_Function.name._M_string_length);
              StringUtil::Format<std::__cxx11::string>
                        (&local_160,(StringUtil *)local_140,&local_100,pbVar12);
              InvalidInputException::InvalidInputException(pIVar11,(string *)&local_160);
              __cxa_throw(pIVar11,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pbVar9->_M_dataplus)._M_p + 1);
            iVar13 = iVar13 - 1;
          } while (iVar13 != 0);
        }
        if (iVar8 == 0) {
          fVar15 = 0.0;
        }
        else {
          fVar15 = 0.0;
          iVar13 = 0;
          do {
            fVar15 = fVar15 + *(float *)(pdVar1 + iVar13 * 4 + uVar10 * 4) *
                              *(float *)(pdVar2 + iVar13 * 4 + (long)pbVar12 * 4);
            iVar13 = iVar13 + 1;
          } while (iVar8 != iVar13);
        }
        *(float *)(pdVar3 + (long)idx * 4) = fVar15;
      }
      else {
        FlatVector::SetNull(result,(idx_t)idx,true);
      }
      idx = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(idx->_M_dataplus)._M_p + 1);
    } while (idx != count);
    if (count == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001)
    {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ArrayGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(result);

	const auto array_size = ArrayType::GetSize(args.data[0].GetType());
	D_ASSERT(array_size == ArrayType::GetSize(args.data[1].GetType()));

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * array_size;
		if (!lhs_child_validity.CheckAllValid(left_offset + array_size, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * array_size;
		if (!rhs_child_validity.CheckAllValid(right_offset + array_size, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;

		res_data[i] = OP::Operation(lhs_data_ptr, rhs_data_ptr, array_size);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}